

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

char * __thiscall spdlog::details::os::getenv_abi_cxx11_(os *this,char *__name)

{
  char *__s;
  char *buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined6 in_stack_ffffffffffffffe0;
  byte bVar1;
  allocator<char> in_stack_ffffffffffffffe7;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  __s = ::getenv(__name);
  bVar1 = 0;
  if (__s == (char *)0x0) {
    std::__cxx11::string::string(this_00);
  }
  else {
    std::allocator<char>::allocator();
    bVar1 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name,__s,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(1,in_stack_ffffffffffffffe0)));
  }
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return (char *)this;
}

Assistant:

std::string SPDLOG_INLINE getenv(const char *field) {
#if defined(_MSC_VER)
    #if defined(__cplusplus_winrt)
    return std::string{};  // not supported under uwp
    #else
    size_t len = 0;
    char buf[128];
    bool ok = ::getenv_s(&len, buf, sizeof(buf), field) == 0;
    return ok ? buf : std::string{};
    #endif
#else  // revert to getenv
    char *buf = ::getenv(field);
    return buf ? buf : std::string{};
#endif
}